

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O1

bool __thiscall
Am_Drawonable_Impl::add_wm_border_offset
          (Am_Drawonable_Impl *this,Window query_drawable,Window expected_parent,int *lb,int *tb,
          int *rb,int *bb,int *outer_left,int *outer_top)

{
  bool bVar1;
  uint d_return;
  uint bw_return;
  uint h_return;
  uint w_return;
  int *local_60;
  Window xlib_parent;
  Window root_return;
  uint d_return_1;
  uint bw_return_1;
  uint nchildren_return;
  Window *children_return;
  
  local_60 = rb;
  XQueryTree(this->screen->display,query_drawable,&root_return,&xlib_parent,&children_return,
             &nchildren_return);
  if (children_return != (Window *)0x0) {
    XFree();
  }
  if (xlib_parent == expected_parent) {
    if ((((this->super_Am_Drawonable).title_bar != true) ||
        ((Am_Drawonable_Impl *)this->owner != this->screen->root)) ||
       (this->xlib_drawable != query_drawable)) {
      if (xlib_parent != this->screen->root->xlib_drawable) {
        return true;
      }
      XGetGeometry(this->screen->display,query_drawable,&root_return,outer_left,outer_top,&w_return,
                   &h_return,&bw_return,&d_return);
      *lb = *lb + bw_return;
      *local_60 = *local_60 + bw_return;
      *tb = *tb + bw_return;
      *bb = *bb + bw_return;
      return true;
    }
  }
  else if (xlib_parent != 0) {
    XGetGeometry(this->screen->display,query_drawable,&root_return,&w_return,&h_return,&bw_return,
                 &d_return,&bw_return_1,&d_return_1);
    *lb = *lb + w_return;
    *tb = *tb + h_return;
    *local_60 = *lb;
    *bb = *lb;
    bVar1 = add_wm_border_offset
                      (this,xlib_parent,expected_parent,lb,tb,local_60,bb,outer_left,outer_top);
    return bVar1;
  }
  return false;
}

Assistant:

bool
Am_Drawonable_Impl::add_wm_border_offset(Window query_drawable,
                                         Window expected_parent, int &lb,
                                         int &tb, int &rb, int &bb,
                                         int &outer_left, int &outer_top)
{

  // Ask X for the parent of 'query_drawable' -- store value in xlib_parent
  Window root_return, xlib_parent, *children_return;
  unsigned int nchildren_return;
  XQueryTree(screen->display, query_drawable, &root_return, &xlib_parent,
             &children_return, &nchildren_return);

  // don't need list of children, so free it right away
  if (children_return)
    XFree(children_return);

  if (expected_parent == xlib_parent) {
    //std::cout << expected_parent << " == " << xlib_parent <<std::endl;

    // If the original window is supposed to have a title bar, and it is
    // at the top-level, but it has not yet been reparented to have a title
    // bar, then all this calculation is bogus.
    if (title_bar && (owner == screen->root) &&
        (query_drawable == xlib_drawable)) {
      //std::cout << "   parenting is messed up, returning false" <<std::endl;
      return false;
    }

    else {
      // done computing border widths (whatever was computed the last time
      // through the recursion is already correct) on MWM only!
      // TWM also uses bw_return here.
      if (xlib_parent == screen->root->xlib_drawable) {
        // We're dealing with a top-level window.  Find its actual outer vals.
        unsigned int w_return, h_return, bw_return, d_return;
        XGetGeometry(screen->display, query_drawable, &root_return, &outer_left,
                     &outer_top, &w_return, &h_return, &bw_return, &d_return);

        //     std::cout << "add_wm_borders: bw == " << bw_return
        //	<< ", query drawable == " << query_drawable <<std::endl;

        // In TWM, the borders are specified by this window's borderwidth.
        // Add this to the borders.  In MWM the values are 0 anyway.
        lb += bw_return;
        rb += bw_return;
        tb += bw_return;
        bb += bw_return;
      }
      //    std::cout << "  Outer: " << outer_left << ", " << outer_top << " " <<std::endl;

      return true;
    }
  } else {
    //std::cout << expected_parent << " != " << xlib_parent <<std::endl;
    if (xlib_parent) {
      // Return offset of current query_drawable drawable from its parent,
      // PLUS the offset of the parent, and set outer left and top during
      // recurson.
      int x_return, y_return;
      unsigned int w_return, h_return, bw_return, d_return;
      XGetGeometry(screen->display, query_drawable, &root_return, &x_return,
                   &y_return, &w_return, &h_return, &bw_return, &d_return);
      lb += x_return;
      tb += y_return;
      //     std::cout << "add_wm_borders: lb == " << lb << ", tb == " << tb
      //	   << ", bw == " << bw_return << ", query drawable == "
      //           << query_drawable <<std::endl;
      rb = lb;
      bb = lb;
      // At this point, expected parent must be the root, because there
      // is never decoration on subwindows.
      return (add_wm_border_offset(xlib_parent, expected_parent, lb, tb, rb, bb,
                                   outer_left, outer_top));
    } else {
      // nullptr xlib_parent means query_window has no parent now, which
      // is probably due to some race condition.  Can't return valid
      // data, so return false.
      //std::cout << "   nullptr parent, returning false" <<std::endl;
      return false;
    }
  }
}